

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_bit(bitstream *str,uint32_t *val)

{
  int iVar1;
  
  if (str->dir == VS_ENCODE) {
    iVar1 = str->bitpos;
    str->curbyte = str->curbyte | (byte)(*val << ((byte)iVar1 & 0x1f));
    if (iVar1 == 0) {
      iVar1 = vs_byte(str);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      str->bitpos = iVar1 + -1;
    }
  }
  else {
    if ((str->hasbyte == 0) && (iVar1 = vs_byte(str), iVar1 != 0)) {
      return 1;
    }
    *val = (uint)((str->curbyte >> (str->bitpos & 0x1fU) & 1) != 0);
    if (str->bitpos == 0) {
      str->hasbyte = 0;
      str->bitpos = 7;
    }
    else {
      str->bitpos = str->bitpos + -1;
    }
  }
  iVar1 = 0;
  if (*val == 0) {
    iVar1 = str->zero_bits + 1;
  }
  str->zero_bits = iVar1;
  return 0;
}

Assistant:

int vs_bit(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		str->curbyte |= *val << str->bitpos;
		if (!str->bitpos) {
			if (vs_byte(str))
				return 1;
		} else {
			str->bitpos--;
		}
	} else {
		if (!str->hasbyte) {
			if (vs_byte(str))
				return 1;
		}
		*val = str->curbyte >> str->bitpos & 1;
		if (!str->bitpos) {
			str->hasbyte = 0;
			str->bitpos = 7;
		} else {
			str->bitpos--;
		}
	}
	if (!*val) {
		str->zero_bits++;
	} else {
		str->zero_bits = 0;
	}
	return 0;
}